

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O2

void Gia_PolyCollectRoots_rec
               (Vec_Int_t *vAdds,Vec_Wec_t *vMap,Vec_Bit_t *vMarks,int iBox,Vec_Int_t *vRoots)

{
  int i;
  int iBox_00;
  int i_00;
  int iVar1;
  Vec_Int_t *p;
  int iVar2;
  int i_01;
  
  for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
    i = Vec_IntEntry(vAdds,iVar2 + iBox * 6);
    p = Vec_WecEntry(vMap,i);
    if (i != 0) {
      for (i_01 = 1; i_01 < p->nSize; i_01 = i_01 + 2) {
        iBox_00 = Vec_IntEntry(p,i_01 + -1);
        i_00 = Vec_IntEntry(p,i_01);
        iVar1 = Vec_IntEntry(vAdds,iBox_00 * 6 + 4);
        if (iVar1 == i) {
          iVar1 = Vec_BitEntry(vMarks,i_00);
          if (iVar1 == 0) {
            Vec_IntPush(vRoots,i_00);
            Gia_PolyCollectRoots_rec(vAdds,vMap,vMarks,iBox_00,vRoots);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Gia_PolyCollectRoots_rec( Vec_Int_t * vAdds, Vec_Wec_t * vMap, Vec_Bit_t * vMarks, int iBox, Vec_Int_t * vRoots )
{
    int k;
    for ( k = 0; k < 3; k++ )
    {
        int i, Index, Sum, Carry = Vec_IntEntry( vAdds, 6*iBox+k );
        Vec_Int_t * vLevel = Vec_WecEntry( vMap, Carry );
        if ( Carry == 0 )
            continue;
        Vec_IntForEachEntryDouble( vLevel, Index, Sum, i )
            if ( Vec_IntEntry(vAdds, 6*Index+4) == Carry && !Vec_BitEntry(vMarks, Sum) )
            {
                Vec_IntPush( vRoots, Sum );
                Gia_PolyCollectRoots_rec( vAdds, vMap, vMarks, Index, vRoots );
            }
    }
}